

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void adjalign(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = u.ualign.record + n;
  iVar1 = iVar3;
  if (((-1 < n) && (iVar1 = u.ualign.record, n != 0)) &&
     (iVar2 = moves / 200 + 10, iVar1 = iVar3, iVar2 <= iVar3)) {
    iVar1 = iVar2;
  }
  u.ualign.record = iVar1;
  return;
}

Assistant:

void adjalign(int n)
{
	int newalign = u.ualign.record + n;

	if (n < 0) {
		if (newalign < u.ualign.record)
			u.ualign.record = newalign;
	} else
		if (newalign > u.ualign.record) {
			u.ualign.record = newalign;
			if (u.ualign.record > ALIGNLIM)
				u.ualign.record = ALIGNLIM;
		}
}